

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddLin.c
# Opt level: O0

int cuddZddLinearSifting(DdManager *table,int lower,int upper)

{
  int iVar1;
  int iVar2;
  int local_44;
  int result;
  int x;
  int size;
  int *var;
  int i;
  int upper_local;
  int lower_local;
  DdManager *table_local;
  
  iVar1 = table->sizeZ;
  empty = table->zero;
  _x = (void *)0x0;
  zdd_entry = (int *)malloc((long)iVar1 << 2);
  if (zdd_entry == (int *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    _x = malloc((long)iVar1 << 2);
    if (_x == (void *)0x0) {
      table->errorCode = CUDD_MEMORY_OUT;
    }
    else {
      for (var._4_4_ = 0; var._4_4_ < iVar1; var._4_4_ = var._4_4_ + 1) {
        zdd_entry[var._4_4_] = table->subtableZ[table->permZ[var._4_4_]].keys;
        *(int *)((long)_x + (long)var._4_4_ * 4) = var._4_4_;
      }
      qsort(_x,(long)iVar1,4,cuddZddUniqueCompare);
      var._4_4_ = 0;
      while( true ) {
        local_44 = iVar1;
        if (table->siftMaxVar <= iVar1) {
          local_44 = table->siftMaxVar;
        }
        if ((local_44 <= var._4_4_) || (table->siftMaxSwap <= zddTotalNumberSwapping)) {
          if (_x != (void *)0x0) {
            free(_x);
          }
          if (zdd_entry != (int *)0x0) {
            free(zdd_entry);
            zdd_entry = (int *)0x0;
          }
          return 1;
        }
        iVar2 = table->permZ[*(int *)((long)_x + (long)var._4_4_ * 4)];
        if (((lower <= iVar2) && (iVar2 <= upper)) &&
           (iVar2 = cuddZddLinearAux(table,iVar2,lower,upper), iVar2 == 0)) break;
        var._4_4_ = var._4_4_ + 1;
      }
    }
  }
  if ((zdd_entry != (int *)0x0) && (zdd_entry != (int *)0x0)) {
    free(zdd_entry);
    zdd_entry = (int *)0x0;
  }
  if ((_x != (void *)0x0) && (_x != (void *)0x0)) {
    free(_x);
  }
  return 0;
}

Assistant:

int
cuddZddLinearSifting(
  DdManager * table,
  int  lower,
  int  upper)
{
    int i;
    int *var;
    int size;
    int x;
    int result;
#ifdef DD_STATS
    int previousSize;
#endif

    size = table->sizeZ;
    empty = table->zero;

    /* Find order in which to sift variables. */
    var = NULL;
    zdd_entry = ABC_ALLOC(int, size);
    if (zdd_entry == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto cuddZddSiftingOutOfMem;
    }
    var = ABC_ALLOC(int, size);
    if (var == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto cuddZddSiftingOutOfMem;
    }

    for (i = 0; i < size; i++) {
        x = table->permZ[i];
        zdd_entry[i] = table->subtableZ[x].keys;
        var[i] = i;
    }

    qsort((void *)var, (size_t)size, sizeof(int), (DD_QSFP)cuddZddUniqueCompare);

    /* Now sift. */
    for (i = 0; i < ddMin(table->siftMaxVar, size); i++) {
        if (zddTotalNumberSwapping >= table->siftMaxSwap)
            break;
        x = table->permZ[var[i]];
        if (x < lower || x > upper) continue;
#ifdef DD_STATS
        previousSize = table->keysZ;
#endif
        result = cuddZddLinearAux(table, x, lower, upper);
        if (!result)
            goto cuddZddSiftingOutOfMem;
#ifdef DD_STATS
        if (table->keysZ < (unsigned) previousSize) {
            (void) fprintf(table->out,"-");
        } else if (table->keysZ > (unsigned) previousSize) {
            (void) fprintf(table->out,"+");     /* should never happen */
            (void) fprintf(table->out,"\nSize increased from %d to %d while sifting variable %d\n", previousSize, table->keysZ , var[i]);
        } else {
            (void) fprintf(table->out,"=");
        }
        fflush(table->out);
#endif
    }

    ABC_FREE(var);
    ABC_FREE(zdd_entry);

    return(1);

cuddZddSiftingOutOfMem:

    if (zdd_entry != NULL) ABC_FREE(zdd_entry);
    if (var != NULL) ABC_FREE(var);

    return(0);

}